

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_sse4.c
# Opt level: O0

void compute_stats_win5_opt_sse4_1
               (uint8_t *dgd,uint8_t *src,int h_start,int h_end,int v_start,int v_end,int dgd_stride
               ,int src_stride,int64_t *M,int64_t *H,int use_downsampled_wiener_stats)

{
  int iVar1;
  long lVar2;
  int in_ECX;
  int in_EDX;
  uint8_t *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  long in_stack_00000018;
  long in_stack_00000020;
  int64_t *H_int_;
  int64_t *H_;
  int32_t idx0;
  int64_t avg_square_sum;
  int vert_end;
  __m128i shuffle;
  int32_t sumY_row [5] [5];
  int32_t sumX_row;
  int downsample_factor;
  uint8_t *dgd_win;
  int32_t sumX;
  int32_t sumY [5] [5];
  int64_t H_int64 [25] [40];
  int32_t H_int32_row [25] [40];
  int32_t H_int32 [25] [40];
  int64_t M_int64 [5] [5];
  int32_t M_int32_row [5] [5];
  int32_t M_int32 [5] [5];
  uint8_t avg;
  int wiener_halfwin;
  int wiener_win2;
  int pixel_count;
  int wiener_win;
  int n;
  int m;
  int l;
  int k;
  int j;
  int i;
  int local_41a4;
  int local_4168 [16];
  __m128i *in_stack_ffffffffffffbed8;
  int in_stack_ffffffffffffbee4;
  int in_stack_ffffffffffffbee8;
  int in_stack_ffffffffffffbeec;
  uint8_t *in_stack_ffffffffffffbef0;
  uint8_t *in_stack_ffffffffffffbef8;
  int local_40fc;
  int local_40e8 [26];
  int32_t *in_stack_ffffffffffffbf80;
  int32_t (*in_stack_ffffffffffffbf88) [5];
  int32_t (*in_stack_ffffffffffffbf90) [5];
  int32_t (*in_stack_ffffffffffffbf98) [40];
  int local_2138 [1000];
  int local_1198 [1000];
  long local_1f8 [26];
  int local_128 [28];
  int local_b8 [25];
  byte local_51;
  undefined4 local_50;
  undefined4 local_4c;
  int local_48;
  undefined4 local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  
  local_44 = 5;
  local_48 = (in_ECX - in_EDX) * (in_R9D - in_R8D);
  local_4c = 0x19;
  local_50 = 2;
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_51 = find_average(in_RDI,in_EDX,in_ECX,in_R8D,in_R9D,in_stack_00000008);
  memset(local_b8,0,100);
  memset(local_128,0,100);
  memset(local_1f8,0,200);
  memset(local_1198,0,4000);
  memset(local_2138,0,4000);
  memset(&stack0xffffffffffffbf88,0,8000);
  memset(local_40e8,0,100);
  local_40fc = 1;
  if ((int)H_int_ != 0) {
    local_40fc = 4;
  }
  memset(local_4168,0,100);
  xx_loadu_128("");
  for (local_30 = local_24; local_30 < local_28; local_30 = local_30 + 0x40) {
    if (local_28 - local_30 < 0x41) {
      local_41a4 = local_28 - local_30;
    }
    else {
      local_41a4 = 0x40;
    }
    local_41a4 = local_41a4 + local_30;
    for (local_2c = local_30; local_2c < local_41a4; local_2c = local_2c + local_40fc) {
      if (((int)H_int_ != 0) && (local_41a4 - local_2c < 4)) {
        local_40fc = local_41a4 - local_2c;
      }
      memset(local_4168,0,100);
      memset(local_128,0,100);
      memset(local_2138,0,4000);
      acc_stat_win5_one_line_sse4_1
                (in_stack_ffffffffffffbef8,in_stack_ffffffffffffbef0,in_stack_ffffffffffffbeec,
                 in_stack_ffffffffffffbee8,in_stack_ffffffffffffbee4,in_stack_ffffffffffffbed8,
                 in_stack_ffffffffffffbf80,in_stack_ffffffffffffbf88,in_stack_ffffffffffffbf90,
                 in_stack_ffffffffffffbf98);
      for (local_34 = 0; local_34 < 5; local_34 = local_34 + 1) {
        for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
          local_40e8[(long)local_34 * 5 + (long)local_38] =
               local_4168[(long)local_34 * 5 + (long)local_38] * local_40fc +
               local_40e8[(long)local_34 * 5 + (long)local_38];
          local_b8[(long)local_34 * 5 + (long)local_38] =
               local_128[(long)local_34 * 5 + (long)local_38] * local_40fc +
               local_b8[(long)local_34 * 5 + (long)local_38];
        }
      }
      for (local_34 = 0; local_34 < 0x19; local_34 = local_34 + 1) {
        for (local_38 = 0; local_38 < 0x28; local_38 = local_38 + 1) {
          local_1198[(long)local_34 * 0x28 + (long)local_38] =
               local_2138[(long)local_34 * 0x28 + (long)local_38] * local_40fc +
               local_1198[(long)local_34 * 0x28 + (long)local_38];
        }
      }
    }
    for (local_34 = 0; local_34 < 5; local_34 = local_34 + 1) {
      for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
        local_1f8[(long)local_34 * 5 + (long)local_38] =
             (long)local_b8[(long)local_34 * 5 + (long)local_38] +
             local_1f8[(long)local_34 * 5 + (long)local_38];
        local_b8[(long)local_34 * 5 + (long)local_38] = 0;
      }
    }
    for (local_34 = 0; local_34 < 0x19; local_34 = local_34 + 1) {
      for (local_38 = 0; local_38 < 0x28; local_38 = local_38 + 1) {
        lVar2 = (long)local_34 * 0x140 + -0x4078;
        *(long *)(&stack0xffffffffffffbf88 + (long)local_38 * 8 + lVar2 + 0x4078) =
             (long)local_1198[(long)local_34 * 0x28 + (long)local_38] +
             *(long *)(&stack0xffffffffffffbf88 + (long)local_38 * 8 + lVar2 + 0x4078);
        local_1198[(long)local_34 * 0x28 + (long)local_38] = 0;
      }
    }
  }
  lVar2 = (ulong)local_51 * (ulong)local_51 * (long)local_48;
  for (local_34 = 0; local_34 < 5; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
      iVar1 = local_38 * 5 + local_34;
      *(ulong *)(in_stack_00000018 + (long)iVar1 * 8) =
           local_1f8[(long)local_34 * 5 + (long)local_38] +
           (lVar2 - (ulong)local_51 * (long)local_40e8[(long)local_34 * 5 + (long)local_38]);
      for (local_3c = 0; local_3c < 5; local_3c = local_3c + 1) {
        for (local_40 = 0; local_40 < 5; local_40 = local_40 + 1) {
          *(ulong *)(in_stack_00000020 + (long)(iVar1 * 0x19) * 8 +
                    (long)(local_3c * 5 + local_40) * 8) =
               (*(long *)(&stack0xffffffffffffbf88 +
                         (long)(local_40 * 8 + local_3c) * 8 + (long)iVar1 * 0x140) + lVar2) -
               (ulong)local_51 *
               (long)(local_40e8[(long)local_34 * 5 + (long)local_38] +
                     local_40e8[(long)local_40 * 5 + (long)local_3c]);
        }
      }
    }
  }
  return;
}

Assistant:

static inline void compute_stats_win5_opt_sse4_1(
    const uint8_t *dgd, const uint8_t *src, int h_start, int h_end, int v_start,
    int v_end, int dgd_stride, int src_stride, int64_t *M, int64_t *H,
    int use_downsampled_wiener_stats) {
  int i, j, k, l, m, n;
  const int wiener_win = WIENER_WIN_CHROMA;
  const int pixel_count = (h_end - h_start) * (v_end - v_start);
  const int wiener_win2 = wiener_win * wiener_win;
  const int wiener_halfwin = (wiener_win >> 1);
  const uint8_t avg =
      find_average(dgd, h_start, h_end, v_start, v_end, dgd_stride);

  int32_t M_int32[WIENER_WIN_CHROMA][WIENER_WIN_CHROMA] = { { 0 } };
  int32_t M_int32_row[WIENER_WIN_CHROMA][WIENER_WIN_CHROMA] = { { 0 } };
  int64_t M_int64[WIENER_WIN_CHROMA][WIENER_WIN_CHROMA] = { { 0 } };
  int32_t H_int32[WIENER_WIN2_CHROMA][WIENER_WIN_CHROMA * 8] = { { 0 } };
  int32_t H_int32_row[WIENER_WIN2_CHROMA][WIENER_WIN_CHROMA * 8] = { { 0 } };
  int64_t H_int64[WIENER_WIN2_CHROMA][WIENER_WIN_CHROMA * 8] = { { 0 } };
  int32_t sumY[WIENER_WIN_CHROMA][WIENER_WIN_CHROMA] = { { 0 } };
  int32_t sumX = 0;
  const uint8_t *dgd_win = dgd - wiener_halfwin * dgd_stride - wiener_halfwin;
  int downsample_factor =
      use_downsampled_wiener_stats ? WIENER_STATS_DOWNSAMPLE_FACTOR : 1;
  int32_t sumX_row = 0;
  int32_t sumY_row[WIENER_WIN_CHROMA][WIENER_WIN_CHROMA] = { { 0 } };

  const __m128i shuffle = xx_loadu_128(g_shuffle_stats_data);
  for (j = v_start; j < v_end; j += 64) {
    const int vert_end = AOMMIN(64, v_end - j) + j;
    for (i = j; i < vert_end; i = i + downsample_factor) {
      if (use_downsampled_wiener_stats &&
          (vert_end - i < WIENER_STATS_DOWNSAMPLE_FACTOR)) {
        downsample_factor = vert_end - i;
      }
      sumX_row = 0;
      memset(sumY_row, 0,
             sizeof(int32_t) * WIENER_WIN_CHROMA * WIENER_WIN_CHROMA);
      memset(M_int32_row, 0,
             sizeof(int32_t) * WIENER_WIN_CHROMA * WIENER_WIN_CHROMA);
      memset(H_int32_row, 0,
             sizeof(int32_t) * WIENER_WIN2_CHROMA * (WIENER_WIN_CHROMA * 8));
      acc_stat_win5_one_line_sse4_1(
          dgd_win + i * dgd_stride, src + i * src_stride, h_start, h_end,
          dgd_stride, &shuffle, &sumX_row, sumY_row, M_int32_row, H_int32_row);
      sumX += sumX_row * downsample_factor;
      // Scale M matrix based on the downsampling factor
      for (k = 0; k < wiener_win; ++k) {
        for (l = 0; l < wiener_win; ++l) {
          sumY[k][l] += (sumY_row[k][l] * downsample_factor);
          M_int32[k][l] += (M_int32_row[k][l] * downsample_factor);
        }
      }
      // Scale H matrix based on the downsampling factor
      for (k = 0; k < WIENER_WIN_CHROMA * WIENER_WIN_CHROMA; ++k) {
        for (l = 0; l < WIENER_WIN_CHROMA * 8; ++l) {
          H_int32[k][l] += (H_int32_row[k][l] * downsample_factor);
        }
      }
    }
    for (k = 0; k < wiener_win; ++k) {
      for (l = 0; l < wiener_win; ++l) {
        M_int64[k][l] += M_int32[k][l];
        M_int32[k][l] = 0;
      }
    }
    for (k = 0; k < WIENER_WIN_CHROMA * WIENER_WIN_CHROMA; ++k) {
      for (l = 0; l < WIENER_WIN_CHROMA * 8; ++l) {
        H_int64[k][l] += H_int32[k][l];
        H_int32[k][l] = 0;
      }
    }
  }

  const int64_t avg_square_sum = (int64_t)avg * (int64_t)avg * pixel_count;
  for (k = 0; k < wiener_win; k++) {
    for (l = 0; l < wiener_win; l++) {
      const int32_t idx0 = l * wiener_win + k;
      M[idx0] =
          M_int64[k][l] + (avg_square_sum - (int64_t)avg * (sumX + sumY[k][l]));
      int64_t *H_ = H + idx0 * wiener_win2;
      int64_t *H_int_ = &H_int64[idx0][0];
      for (m = 0; m < wiener_win; m++) {
        for (n = 0; n < wiener_win; n++) {
          H_[m * wiener_win + n] = H_int_[n * 8 + m] + avg_square_sum -
                                   (int64_t)avg * (sumY[k][l] + sumY[n][m]);
        }
      }
    }
  }
}